

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O1

void __thiscall EPoller::fillActiveChannels(EPoller *this,int numEvents,ChannelList *activeChannels)

{
  int iVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  ulong uVar9;
  undefined1 local_40 [8];
  shared_ptr<Channel> channel;
  
  if (0 < numEvents) {
    uVar9 = 0;
    do {
      iVar1 = (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9].data.fd;
      uVar2 = (this->channels_)._M_h._M_bucket_count;
      uVar7 = (ulong)(long)iVar1 % uVar2;
      p_Var3 = (this->channels_)._M_h._M_buckets[uVar7];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var3, p_Var8 = p_Var3->_M_nxt, iVar1 != *(int *)&p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var6[1]._M_nxt % uVar2 != uVar7) ||
             (p_Var5 = p_Var8, p_Var8 = p_Var6, iVar1 == *(int *)&p_Var6[1]._M_nxt))
          goto LAB_0011c436;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_0011c436:
      if (p_Var5 == (__node_base_ptr)0x0) {
        p_Var6 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var6 = p_Var5->_M_nxt;
      }
      if (p_Var6 == (_Hash_node_base *)0x0) {
        __assert_fail("it != channels_.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                      ,0x27,"void EPoller::fillActiveChannels(int, ChannelList *) const");
      }
      local_40 = (undefined1  [8])p_Var6[2]._M_nxt;
      channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var6[3]._M_nxt;
      if (channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4 = &((channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<Channel>)._M_weak_this.
                    super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var4 = &((channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<Channel>)._M_weak_this.
                    super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
        }
      }
      ((element_type *)local_40)->revents_ =
           (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9].events;
      std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::push_back
                (activeChannels,(value_type *)local_40);
      if (channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)numEvents);
  }
  return;
}

Assistant:

void EPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const {
    for(int i = 0; i < numEvents; ++i) {
        int fd = events_[i].data.fd;
        auto it = channels_.find(fd);
        assert(it != channels_.end());
        auto channel = it->second;
        channel->setRevents(events_[i].events);
        activeChannels->push_back(channel);
    } 
}